

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.h
# Opt level: O2

void __thiscall Client::printHeader(Client *this,char *name,Result *result)

{
  _Head_base<0UL,_httplib::Response_*,_false> this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  format_string_t<const_char_*&,_std::__cxx11::basic_string<char>_> fmt;
  allocator<char> local_59;
  char *name_local;
  string local_50;
  string local_30;
  
  this_00._M_head_impl =
       (result->res_)._M_t.
       super___uniq_ptr_impl<httplib::Response,_std::default_delete<httplib::Response>_>._M_t.
       super__Tuple_impl<0UL,_httplib::Response_*,_std::default_delete<httplib::Response>_>.
       super__Head_base<0UL,_httplib::Response_*,_false>._M_head_impl;
  name_local = name;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,name,&local_59);
  httplib::Response::get_header_value(&local_50,this_00._M_head_impl,&local_30,0);
  fmt.str_.size_ = (size_t)&name_local;
  fmt.str_.data_ = (char *)0x6;
  spdlog::warn<char_const*&,std::__cxx11::string>((spdlog *)"{}: {}",fmt,(char **)&local_50,in_R8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void printHeader(const char* name, const httplib::Result& result) const {
        spdlog::warn("{}: {}", name, result->get_header_value(name));
    }